

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE::Param::display(Param *this,ostream *out)

{
  ostream *poVar1;
  void *pvVar2;
  ostream *in_RSI;
  int *in_RDI;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_00000238;
  ostream *in_stack_00000240;
  
  poVar1 = std::operator<<(in_RSI,"d= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*in_RDI);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"D= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDI[1]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"alpha= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 4));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Psi0= ");
  poVar1 = Eigen::operator<<(in_stack_00000240,in_stack_00000238);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"sigma0= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 10));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"wsigma= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0xc));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"wSigma= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x10));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"wNu= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x12));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"wLambda= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x14));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"wpsi= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0xe));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"wPsi= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x16));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"p0= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x1a));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"nOutliers= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDI[0x18]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"multiValuedSignificance= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x1c));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"nSolMin= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDI[0x1e]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"nSolMax= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDI[0x1f]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"iterMax= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDI[0x20]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"defaultSave= ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 0x22));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"saveOnExit= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(*(byte *)(in_RDI + 0x21) & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"accelerated= ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(*(byte *)(in_RDI + 2) & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  pvVar2 = (void *)std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::Param::display(std::ostream &out) const
{
    out << EXPAND(d) << std::endl;
    out << EXPAND(D) << std::endl;

    out << EXPAND(alpha) << std::endl;

    out << EXPAND(Psi0) << std::endl;
    out << EXPAND(sigma0) << std::endl;

    out << EXPAND(wsigma) << std::endl;
    out << EXPAND(wSigma) << std::endl;
    out << EXPAND(wNu) << std::endl;
    out << EXPAND(wLambda) << std::endl;
    out << EXPAND(wpsi) << std::endl;
    out << EXPAND(wPsi) << std::endl;

    out << EXPAND(p0) << std::endl;
    out << EXPAND(nOutliers) << std::endl;

    out << EXPAND(multiValuedSignificance) << std::endl;
    out << EXPAND(nSolMin) << std::endl;
    out << EXPAND(nSolMax) << std::endl;
    out << EXPAND(iterMax) << std::endl;

    out << EXPAND(defaultSave) << std::endl;
    out << EXPAND(saveOnExit) << std::endl;
    out << EXPAND(accelerated) << std::endl;

    out << std::endl << std::endl;
}